

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event_loop.hpp
# Opt level: O3

bool __thiscall
cppurses::detail::Timer_event_loop::unregister_widget(Timer_event_loop *this,Widget *w)

{
  size_t sVar1;
  pair<std::_Rb_tree_iterator<cppurses::Widget_*>,_std::_Rb_tree_iterator<cppurses::Widget_*>_>
  pVar2;
  Widget *local_20;
  
  local_20 = w;
  pVar2 = std::
          _Rb_tree<cppurses::Widget_*,_cppurses::Widget_*,_std::_Identity<cppurses::Widget_*>,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
          ::equal_range(&(this->registered_widgets_)._M_t,&local_20);
  sVar1 = (this->registered_widgets_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<cppurses::Widget_*,_cppurses::Widget_*,_std::_Identity<cppurses::Widget_*>,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
  ::_M_erase_aux(&(this->registered_widgets_)._M_t,(_Base_ptr)pVar2.first._M_node,
                 (_Base_ptr)pVar2.second._M_node);
  return sVar1 - (this->registered_widgets_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1;
}

Assistant:

bool unregister_widget(Widget& w)
    {
        return registered_widgets_.erase(&w) == 1;
    }